

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

int splittingStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  ARKodeMem in_XMM0_Qa;
  SUNErrCode err;
  int i;
  int retval;
  ARKodeSplittingStepMem step_mem;
  ARKodeSplittingStepMem *in_stack_ffffffffffffff98;
  undefined8 uVar2;
  char *in_stack_ffffffffffffffa0;
  ARKodeMem in_stack_ffffffffffffffa8;
  int local_40;
  int local_4;
  
  local_4 = splittingStep_AccessStepMem
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                      );
  if (local_4 == 0) {
    for (local_40 = 0; local_40 < iRam0000000000000018; local_40 = local_40 + 1) {
      uVar2 = in_RDX;
      if (local_40 != 0) {
        uVar2 = *(undefined8 *)(in_RDI + 0x268);
      }
      iVar1 = SUNStepper_FullRhs(in_XMM0_Qa,
                                 *(undefined8 *)(lRam0000000000000000 + (long)local_40 * 8),in_RSI,
                                 uVar2,2);
      if (iVar1 != 0) {
        arkProcessError(in_XMM0_Qa,(int)in_RDI,-8,(char *)0xc4,"splittingStep_FullRHS",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                        ,
                        "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                       );
        return -8;
      }
      if (0 < local_40) {
        N_VLinearSum(0x3ff0000000000000,in_RDX,*(undefined8 *)(in_RDI + 0x268),in_RDX);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int splittingStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y,
                                 N_Vector f, SUNDIALS_MAYBE_UNUSED int mode)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  for (int i = 0; i < step_mem->partitions; i++)
  {
    SUNErrCode err = SUNStepper_FullRhs(step_mem->steppers[i], t, y,
                                        i == 0 ? f : ark_mem->tempv1,
                                        SUN_FULLRHS_OTHER);
    if (err != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return ARK_RHSFUNC_FAIL;
    }
    if (i > 0) { N_VLinearSum(ONE, f, ONE, ark_mem->tempv1, f); }
  }

  return ARK_SUCCESS;
}